

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::averageDownCoeffsSameAmrLevel
          (MLEBABecLap *this,int amrlev,Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a
          ,Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           *b,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *b_eb)

{
  FabArray<amrex::FArrayBox> *this_00;
  pointer pIVar1;
  pointer pMVar2;
  pointer paVar3;
  pointer ppMVar4;
  MultiFab *crse;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  IntVect ratio;
  IntVect local_88;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *local_78;
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  *local_70;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_68;
  Array<MultiFab_*,_3> local_60;
  Array<const_MultiFab_*,_3> local_48;
  
  uVar5 = (int)((long)(a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_start >> 7) * -0x55555555;
  if (1 < (int)uVar5) {
    uVar8 = 1;
    lVar6 = 0x180;
    lVar9 = 0;
    lVar7 = 0;
    local_78 = a;
    local_70 = b;
    local_68 = b_eb;
    do {
      if (amrlev < 1) {
        pIVar1 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_88.vect[2] = *(int *)((long)pIVar1->vect + lVar9 + 8);
        local_88.vect._0_8_ = *(undefined8 *)((long)pIVar1->vect + lVar9);
      }
      else {
        local_88.vect[0] = 2;
        local_88.vect[1] = 2;
        local_88.vect[2] = 2;
      }
      pMVar2 = (local_78->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = (FabArray<amrex::FArrayBox> *)
                ((long)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar6);
      if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
        EB_average_down((MultiFab *)
                        ((long)&pMVar2[-1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase +
                        lVar6),(MultiFab *)this_00,0,1,&local_88);
      }
      else {
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (this_00,0.0,0,
                   *(int *)((long)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           lVar6 + 0xcc),
                   (IntVect *)
                   ((long)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                   lVar6 + 0xc0));
      }
      paVar3 = (local_70->
               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48._M_elems[0] =
           (MultiFab *)((long)&paVar3->_M_elems[0].super_FabArray<amrex::FArrayBox> + lVar7);
      local_48._M_elems[1] = (MultiFab *)((long)(paVar3->_M_elems + 1) + lVar7);
      local_48._M_elems[2] = (MultiFab *)((long)(paVar3->_M_elems + 2) + lVar7);
      local_60._M_elems[0] =
           (MultiFab *)((long)&paVar3[1]._M_elems[0].super_FabArray<amrex::FArrayBox> + lVar7);
      local_60._M_elems[1] = (MultiFab *)((long)(paVar3[1]._M_elems + 1) + lVar7);
      local_60._M_elems[2] = (MultiFab *)((long)(paVar3[1]._M_elems + 2) + lVar7);
      EB_average_down_faces(&local_48,&local_60,&local_88,0);
      ppMVar4 = (local_68->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      crse = ppMVar4[uVar8];
      if (crse != (MultiFab *)0x0) {
        EB_average_down_boundaries(ppMVar4[uVar8 - 1],crse,&local_88,0);
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x180;
      lVar7 = lVar7 + 0x480;
      lVar9 = lVar9 + 0xc;
    } while ((uVar5 & 0x7fffffff) != uVar8);
  }
  return;
}

Assistant:

void
MLEBABecLap::averageDownCoeffsSameAmrLevel (int amrlev, Vector<MultiFab>& a,
                                            Vector<Array<MultiFab,AMREX_SPACEDIM> >& b,
                                            const Vector<MultiFab*>& b_eb)
{
    int nmglevs = a.size();
    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[mglev-1];

        if (m_a_scalar == 0.0)
        {
            a[mglev].setVal(0.0);
        }
        else
        {
            amrex::EB_average_down(a[mglev-1], a[mglev], 0, 1, ratio);
        }

        amrex::EB_average_down_faces(amrex::GetArrOfConstPtrs(b[mglev-1]),
                                     amrex::GetArrOfPtrs(b[mglev]),
                                     ratio, 0);

        if (b_eb[mglev])
        {
            amrex::EB_average_down_boundaries(*b_eb[mglev-1], *b_eb[mglev],
                                              ratio, 0);
        }
    }
}